

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutApi.c
# Opt level: O1

void Cut_NodeFreeCuts(Cut_Man_t *p,int Node)

{
  Cut_Cut_t *pCVar1;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pCVar2;
  
  pCut = Cut_NodeReadCutsNew(p,Node);
  if (pCut != (Cut_Cut_t *)0x0) {
    pCVar1 = pCut->pNext;
    while (pCVar2 = pCVar1, Cut_CutRecycle(p,pCut), pCVar2 != (Cut_Cut_t *)0x0) {
      pCut = pCVar2;
      pCVar1 = pCVar2->pNext;
    }
    if ((Node < 0) || (p->vCutsNew->nSize <= Node)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    p->vCutsNew->pArray[(uint)Node] = (void *)0x0;
  }
  return;
}

Assistant:

void Cut_NodeFreeCuts( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pList, * pCut, * pCut2;
    pList = Cut_NodeReadCutsNew( p, Node );
    if ( pList == NULL )
        return;
    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        Cut_CutRecycle( p, pCut );
    Cut_NodeWriteCutsNew( p, Node, NULL );
}